

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_CCtx_trace(ZSTD_CCtx *cctx,size_t extraCSize)

{
  bool local_61;
  undefined4 local_60;
  uint local_5c;
  ZSTD_Trace trace;
  int streaming;
  size_t extraCSize_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->traceCtx != 0) {
    local_61 = true;
    if ((cctx->inBuffSize == 0) && (local_61 = true, cctx->outBuffSize == 0)) {
      local_61 = 0 < (cctx->appliedParams).nbWorkers;
    }
    trace.dctx._4_4_ = (uint)local_61;
    memset(&local_60,0,0x40);
    local_60 = 0x2909;
    local_5c = trace.dctx._4_4_;
    trace.version = cctx->dictID;
    trace._8_8_ = cctx->dictContentSize;
    trace.dictionarySize = cctx->consumedSrcSize;
    trace.uncompressedSize = cctx->producedCSize + extraCSize;
    trace.compressedSize = (size_t)&cctx->appliedParams;
    trace.params = (ZSTD_CCtx_params_s *)cctx;
    ZSTD_trace_compress_end(cctx->traceCtx,&local_60);
  }
  cctx->traceCtx = 0;
  return;
}

Assistant:

void ZSTD_CCtx_trace(ZSTD_CCtx* cctx, size_t extraCSize)
{
#if ZSTD_TRACE
    if (cctx->traceCtx && ZSTD_trace_compress_end != NULL) {
        int const streaming = cctx->inBuffSize > 0 || cctx->outBuffSize > 0 || cctx->appliedParams.nbWorkers > 0;
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        trace.dictionaryID = cctx->dictID;
        trace.dictionarySize = cctx->dictContentSize;
        trace.uncompressedSize = cctx->consumedSrcSize;
        trace.compressedSize = cctx->producedCSize + extraCSize;
        trace.params = &cctx->appliedParams;
        trace.cctx = cctx;
        ZSTD_trace_compress_end(cctx->traceCtx, &trace);
    }
    cctx->traceCtx = 0;
#else
    (void)cctx;
    (void)extraCSize;
#endif
}